

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

nn_cmsghdr * nn_cmsg_nxthdr_(nn_msghdr *mhdr,nn_cmsghdr *cmsg)

{
  ulong uVar1;
  nn_cmsghdr *pnVar2;
  nn_cmsghdr *p;
  
  if (mhdr != (nn_msghdr *)0x0) {
    p = (nn_cmsghdr *)mhdr->msg_control;
    uVar1 = mhdr->msg_controllen;
    if (uVar1 == 0xffffffffffffffff) {
      p = (nn_cmsghdr *)p->cmsg_len;
      uVar1 = nn_chunk_size(p);
    }
    if (0xf < uVar1) {
      pnVar2 = p;
      if (cmsg != (nn_cmsghdr *)0x0) {
        pnVar2 = (nn_cmsghdr *)((long)&cmsg->cmsg_len + (cmsg->cmsg_len + 7 & 0xfffffffffffffff8));
      }
      if ((ulong)((long)pnVar2 + (0x10 - (long)p)) <= uVar1) {
        if ((long)pnVar2 + ((pnVar2->cmsg_len + 7 & 0xfffffffffffffff8) - (long)p) <= uVar1) {
          return pnVar2;
        }
        return (nn_cmsghdr *)0x0;
      }
    }
  }
  return (nn_cmsghdr *)0x0;
}

Assistant:

struct nn_cmsghdr *nn_cmsg_nxthdr_ (const struct nn_msghdr *mhdr,
    const struct nn_cmsghdr *cmsg)
{
    char *data;
    size_t sz;
    struct nn_cmsghdr *next;
    size_t headsz;

    /*  Early return if no message is provided. */
    if (nn_slow (mhdr == NULL))
        return NULL;

    /*  Get the actual data. */
    if (mhdr->msg_controllen == NN_MSG) {
        data = *((void**) mhdr->msg_control);
        sz = nn_chunk_size (data);
    }
    else {
        data = (char*) mhdr->msg_control;
        sz = mhdr->msg_controllen;
    }

    /*  Ancillary data allocation was not even large enough for one element. */
    if (nn_slow (sz < NN_CMSG_SPACE (0)))
        return NULL;

    /*  If cmsg is set to NULL we are going to return first property.
        Otherwise move to the next property. */
    if (!cmsg)
        next = (struct nn_cmsghdr*) data;
    else
        next = (struct nn_cmsghdr*)
            (((char*) cmsg) + NN_CMSG_ALIGN_ (cmsg->cmsg_len));

    /*  If there's no space for next property, treat it as the end
        of the property list. */
    headsz = ((char*) next) - data;
    if (headsz + NN_CMSG_SPACE (0) > sz ||
          headsz + NN_CMSG_ALIGN_ (next->cmsg_len) > sz)
        return NULL;
    
    /*  Success. */
    return next;
}